

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_fix.cpp
# Opt level: O2

void Omega_h::grade_fix_adapt(Mesh *mesh,AdaptOpts *opts,Reals *target_metric,bool verbose)

{
  bool bVar1;
  bool bVar2;
  LO nmetrics;
  Int IVar3;
  ostream *poVar4;
  undefined7 in_register_00000009;
  char *pcVar5;
  Real RVar6;
  allocator local_89;
  string local_88;
  double local_68;
  Write<double> local_60;
  Write<double> local_50;
  Write<double> local_40;
  
  if ((int)CONCAT71(in_register_00000009,verbose) == 0) {
    bVar1 = false;
  }
  else {
    bVar1 = can_print(mesh);
  }
  nmetrics = Mesh::nverts(mesh);
  Write<double>::Write(&local_40,&target_metric->write_);
  IVar3 = get_metrics_dim(nmetrics,(Reals *)&local_40);
  Write<double>::~Write(&local_40);
  if (bVar1 != false) {
    std::operator<<((ostream *)&std::cout,"Limiting target metric gradation...\n");
  }
  Write<double>::Write(&local_50,&target_metric->write_);
  limit_metric_gradation((Omega_h *)&local_88,mesh,(Reals *)&local_50,0.5,0.01,true);
  Write<double>::operator=(&target_metric->write_,(Write<signed_char> *)&local_88);
  Write<double>::~Write((Write<double> *)&local_88);
  Write<double>::~Write(&local_50);
  std::__cxx11::string::string((string *)&local_88,"target_metric",&local_89);
  Mesh::remove_tag(mesh,0,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string((string *)&local_88,"target_metric",&local_89);
  Write<double>::Write(&local_60,&target_metric->write_);
  Mesh::add_tag<double>(mesh,0,&local_88,((IVar3 + 1) * IVar3) / 2,(Read<double> *)&local_60,false);
  Write<double>::~Write(&local_60);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string((string *)&local_88,"metric",&local_89);
  bVar2 = Mesh::has_tag(mesh,0,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  if (bVar2) {
    if (bVar1 != false) {
      std::operator<<((ostream *)&std::cout,
                      "Mesh already has \"metric\" on vertices, assuming that is current\n");
    }
  }
  else {
    if (bVar1 != false) {
      std::operator<<((ostream *)&std::cout,"Deriving implied metric...\n");
    }
    if (IVar3 == 1) {
      add_implied_isos_tag(mesh);
    }
    else {
      add_implied_metric_tag(mesh);
    }
  }
  RVar6 = Mesh::min_quality(mesh);
  if (bVar1 == false) {
    if (RVar6 < opts->min_quality_allowed) {
      fix(mesh,opts,(uint)(IVar3 == 1),true);
    }
  }
  else {
    local_68 = RVar6;
    std::operator<<((ostream *)&std::cout,"Initial mesh has minimum quality ");
    std::ostream::_M_insert<double>(local_68);
    if (opts->min_quality_allowed <= local_68) {
      pcVar5 = ", which is good\n";
    }
    else {
      std::operator<<((ostream *)&std::cout," < minimum acceptable quality ");
      poVar4 = std::ostream::_M_insert<double>(opts->min_quality_allowed);
      std::operator<<(poVar4,'\n');
      std::operator<<((ostream *)&std::cout,
                      "Omega_h will now attempt to repair the initial mesh quality.\n");
      std::operator<<((ostream *)&std::cout,"This could take some time...\n");
      fix(mesh,opts,(uint)(IVar3 == 1),true);
      pcVar5 = "\nOmega_h is done repairing mesh quality!\n\n";
    }
    std::operator<<((ostream *)&std::cout,pcVar5);
    std::operator<<((ostream *)&std::cout,"Adapting...\n");
  }
  while( true ) {
    bVar2 = approach_metric(mesh,opts,0.0001);
    if (!bVar2) break;
    adapt(mesh,opts);
  }
  if (bVar1 != false) {
    std::operator<<((ostream *)&std::cout,"\nDone adapting!\n\n");
  }
  return;
}

Assistant:

void grade_fix_adapt(
    Mesh* mesh, AdaptOpts const& opts, Reals target_metric, bool verbose) {
  verbose = verbose && can_print(mesh);
  auto metric_dim = get_metrics_dim(mesh->nverts(), target_metric);
  if (verbose) std::cout << "Limiting target metric gradation...\n";
  target_metric = Omega_h::limit_metric_gradation(mesh, target_metric, 0.5);
  mesh->remove_tag(VERT, "target_metric");
  mesh->add_tag(VERT, "target_metric", symm_ncomps(metric_dim), target_metric);
  if (mesh->has_tag(0, "metric")) {
    if (verbose)
      std::cout << "Mesh already has \"metric\" on vertices, assuming that is "
                   "current\n";
  } else {
    if (verbose) std::cout << "Deriving implied metric...\n";
    if (metric_dim == 1) {
      Omega_h::add_implied_isos_tag(mesh);
    } else {
      Omega_h::add_implied_metric_tag(mesh);
    }
  }
  auto min_qual = mesh->min_quality();
  if (verbose) std::cout << "Initial mesh has minimum quality " << min_qual;
  if (min_qual < opts.min_quality_allowed) {
    if (verbose) {
      std::cout << " < minimum acceptable quality " << opts.min_quality_allowed
                << '\n';
      std::cout
          << "Omega_h will now attempt to repair the initial mesh quality.\n";
      std::cout << "This could take some time...\n";
    }
    auto isotropy =
        (metric_dim == 1 ? OMEGA_H_ISO_LENGTH : OMEGA_H_ANISOTROPIC);
    Omega_h::fix(mesh, opts, isotropy, /*verbose=*/true);
    if (verbose) std::cout << "\nOmega_h is done repairing mesh quality!\n\n";
  } else {
    if (verbose) std::cout << ", which is good\n";
  }
  if (verbose) std::cout << "Adapting...\n";
  while (Omega_h::approach_metric(mesh, opts)) {
    Omega_h::adapt(mesh, opts);
  }
  if (verbose) std::cout << "\nDone adapting!\n\n";
}